

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O1

PVG_FT_Outline *
ft_outline_convert(plutovg_path_t *path,plutovg_matrix_t *matrix,plutovg_stroke_data_t *stroke_data)

{
  float fVar1;
  float fVar2;
  plutovg_line_cap_t pVar3;
  plutovg_line_join_t pVar4;
  _Bool _Var5;
  plutovg_path_command_t pVar6;
  char *pcVar7;
  long lVar8;
  plutovg_path_t *path_00;
  PVG_FT_Outline *outline;
  PVG_FT_Outline *outline_00;
  int iVar9;
  PVG_FT_Vector *pPVar10;
  int *piVar11;
  PVG_FT_Stroker_LineCap line_cap;
  PVG_FT_Stroker_LineJoin line_join;
  double dVar12;
  double dVar13;
  plutovg_point_t points [3];
  plutovg_path_iterator_t it;
  plutovg_point_t local_78;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  plutovg_path_t *local_60;
  plutovg_matrix_t *local_58;
  double local_50;
  PVG_FT_UInt local_44;
  plutovg_path_iterator_t local_40;
  
  if (stroke_data == (plutovg_stroke_data_t *)0x0) {
    plutovg_path_iterator_init(&local_40,path);
    outline_00 = ft_outline_create(path->num_points,path->num_contours);
    _Var5 = plutovg_path_iterator_has_next(&local_40);
    if (_Var5) {
      piVar11 = &outline_00->n_points;
      do {
        pVar6 = plutovg_path_iterator_next(&local_40,&local_78);
        switch(pVar6) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
          plutovg_matrix_map_points(matrix,&local_78,&local_78,1);
          pPVar10 = outline_00->points;
          iVar9 = outline_00->n_points;
          pPVar10[iVar9].x = (long)(local_78.x * 64.0);
          pPVar10[iVar9].y = (long)(local_78.y * 64.0);
          outline_00->tags[iVar9] = '\x01';
          if (outline_00->n_points != 0) {
            outline_00->contours[outline_00->n_contours] = outline_00->n_points + -1;
            outline_00->n_contours = outline_00->n_contours + 1;
          }
          pcVar7 = outline_00->contours_flag + outline_00->n_contours;
          goto LAB_0012d420;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
          plutovg_matrix_map_points(matrix,&local_78,&local_78,1);
          pPVar10 = outline_00->points;
          lVar8 = (long)outline_00->n_points;
          fVar1 = local_78.x;
          fVar2 = local_78.y;
          break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
          plutovg_matrix_map_points(matrix,&local_78,&local_78,3);
          pPVar10 = outline_00->points;
          iVar9 = outline_00->n_points;
          pPVar10[iVar9].x = (long)(local_78.x * 64.0);
          pPVar10[iVar9].y = (long)(local_78.y * 64.0);
          outline_00->tags[iVar9] = '\x02';
          iVar9 = outline_00->n_points;
          lVar8 = (long)iVar9 + 1;
          outline_00->n_points = (int)lVar8;
          pPVar10 = outline_00->points;
          pPVar10[lVar8].x = (long)(local_70 * 64.0);
          pPVar10[lVar8].y = (long)(local_6c * 64.0);
          outline_00->tags[(long)iVar9 + 1] = '\x02';
          lVar8 = (long)outline_00->n_points + 1;
          outline_00->n_points = (int)lVar8;
          pPVar10 = outline_00->points;
          fVar1 = local_68;
          fVar2 = local_64;
          break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
          outline_00->contours_flag[outline_00->n_contours] = '\0';
          if ((long)outline_00->n_contours == 0) {
            iVar9 = 0;
          }
          else {
            iVar9 = outline_00->contours[(long)outline_00->n_contours + -1] + 1;
          }
          lVar8 = (long)*piVar11;
          if (iVar9 == *piVar11) goto switchD_0012d25b_default;
          pPVar10 = outline_00->points;
          pPVar10[lVar8].x = pPVar10[iVar9].x;
          pPVar10[lVar8].y = pPVar10[iVar9].y;
          goto LAB_0012d41c;
        default:
          goto switchD_0012d25b_default;
        }
        pPVar10[lVar8].x = (long)(fVar1 * 64.0);
        pPVar10[lVar8].y = (long)(fVar2 * 64.0);
LAB_0012d41c:
        pcVar7 = outline_00->tags + lVar8;
LAB_0012d420:
        *pcVar7 = '\x01';
        *piVar11 = *piVar11 + 1;
switchD_0012d25b_default:
        _Var5 = plutovg_path_iterator_has_next(&local_40);
      } while (_Var5);
    }
    if (outline_00->n_points != 0) {
      outline_00->contours[outline_00->n_contours] = outline_00->n_points + -1;
      outline_00->n_contours = outline_00->n_contours + 1;
    }
  }
  else {
    dVar12 = (double)(matrix->a * matrix->a + matrix->b * matrix->b);
    if (dVar12 < 0.0) {
      dVar12 = sqrt(dVar12);
    }
    else {
      dVar12 = SQRT(dVar12);
    }
    dVar13 = (double)(matrix->c * matrix->c + matrix->d * matrix->d);
    local_60 = path;
    local_58 = matrix;
    if (dVar13 < 0.0) {
      local_50 = dVar12;
      dVar13 = sqrt(dVar13);
      dVar12 = local_50;
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    dVar12 = hypot(dVar12,dVar13);
    fVar1 = (stroke_data->style).miter_limit;
    pVar3 = (stroke_data->style).cap;
    pVar4 = (stroke_data->style).join;
    line_cap = (PVG_FT_Stroker_LineCap)(pVar3 == PLUTOVG_LINE_CAP_ROUND);
    if (pVar3 == PLUTOVG_LINE_CAP_SQUARE) {
      line_cap = PVG_FT_STROKER_LINECAP_SQUARE;
    }
    line_join = PVG_FT_STROKER_LINEJOIN_BEVEL;
    if (pVar4 != PLUTOVG_LINE_JOIN_BEVEL) {
      line_join = (uint)(pVar4 != PLUTOVG_LINE_JOIN_ROUND) * 3;
    }
    fVar2 = (stroke_data->style).width;
    PVG_FT_Stroker_New((PVG_FT_Stroker *)&local_78);
    PVG_FT_Stroker_Set((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),
                       (long)((double)fVar2 * (dVar12 / 1.4142135381698608) * 0.5 * 64.0),line_cap,
                       line_join,(long)(fVar1 * 65536.0));
    iVar9 = (stroke_data->dash).array.size;
    if (iVar9 == 0) {
      outline = ft_outline_convert(local_60,local_58,(plutovg_stroke_data_t *)0x0);
    }
    else {
      path_00 = plutovg_path_clone_dashed
                          (local_60,(stroke_data->dash).offset,(stroke_data->dash).array.data,iVar9)
      ;
      outline = ft_outline_convert(path_00,local_58,(plutovg_stroke_data_t *)0x0);
      plutovg_path_destroy(path_00);
    }
    PVG_FT_Stroker_ParseOutline((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),outline);
    PVG_FT_Stroker_GetCounts
              ((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),(PVG_FT_UInt *)&local_40,&local_44);
    outline_00 = ft_outline_create((int)local_40.elements,local_44);
    PVG_FT_Stroker_Export((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x),outline_00);
    PVG_FT_Stroker_Done((PVG_FT_Stroker)CONCAT44(local_78.y,local_78.x));
    free(outline);
  }
  return outline_00;
}

Assistant:

static PVG_FT_Outline* ft_outline_convert(const plutovg_path_t* path, const plutovg_matrix_t* matrix, const plutovg_stroke_data_t* stroke_data)
{
    if(stroke_data) {
        return ft_outline_convert_stroke(path, matrix, stroke_data);
    }

    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    PVG_FT_Outline* outline = ft_outline_create(path->num_points, path->num_contours);
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_move_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            plutovg_matrix_map_points(matrix, points, points, 1);
            ft_outline_line_to(outline, points[0].x, points[0].y);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_points(matrix, points, points, 3);
            ft_outline_cubic_to(outline, points[0].x, points[0].y, points[1].x, points[1].y, points[2].x, points[2].y);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            ft_outline_close(outline);
            break;
        }
    }

    ft_outline_end(outline);
    return outline;
}